

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O0

int cmac_test_wth_cipher
              (int verbose,char *testname,uchar *key,int keybits,uchar *messages,
              uint *message_lengths,uchar *expected_result,mbedtls_cipher_type_t cipher_type,
              int block_size,int num_tests)

{
  int iVar1;
  mbedtls_cipher_info_t *cipher_info_00;
  uchar local_58 [8];
  uchar output [16];
  int ret;
  int i;
  mbedtls_cipher_info_t *cipher_info;
  uint *message_lengths_local;
  uchar *messages_local;
  int keybits_local;
  uchar *key_local;
  char *testname_local;
  int verbose_local;
  int iVar2;
  int iVar3;
  
  output[8] = '\0';
  output[9] = '\0';
  output[10] = '\0';
  output[0xb] = '\0';
  cipher_info_00 = mbedtls_cipher_info_from_type(cipher_type);
  if (cipher_info_00 == (mbedtls_cipher_info_t *)0x0) {
    output[8] = 0x80;
    output[9] = 0x9f;
    output[10] = 0xff;
    output[0xb] = 0xff;
  }
  else {
    output[0xc] = '\0';
    output[0xd] = '\0';
    output[0xe] = '\0';
    output[0xf] = '\0';
    for (; (int)output._12_4_ < num_tests; output._12_4_ = output._12_4_ + 1) {
      if (verbose != 0) {
        printf("  %s CMAC #%u: ",testname,(ulong)(output._12_4_ + 1));
      }
      output._8_4_ = mbedtls_cipher_cmac(cipher_info_00,key,(long)keybits,messages,
                                         (ulong)message_lengths[(int)output._12_4_],local_58);
      if (output._8_4_ != 0) {
        if (verbose == 0) {
          return output._8_4_;
        }
        printf("failed\n");
        iVar2._0_1_ = output[8];
        iVar2._1_1_ = output[9];
        iVar2._2_1_ = output[10];
        iVar2._3_1_ = output[0xb];
        return iVar2;
      }
      output._8_4_ = memcmp(local_58,expected_result + output._12_4_ * block_size,(long)block_size);
      if (output._8_4_ != 0) {
        if (verbose == 0) {
          return output._8_4_;
        }
        printf("failed\n");
        iVar3._0_1_ = output[8];
        iVar3._1_1_ = output[9];
        iVar3._2_1_ = output[10];
        iVar3._3_1_ = output[0xb];
        return iVar3;
      }
      if (verbose != 0) {
        printf("passed\n");
      }
    }
    output[8] = '\0';
    output[9] = '\0';
    output[10] = '\0';
    output[0xb] = '\0';
  }
  iVar1._0_1_ = output[8];
  iVar1._1_1_ = output[9];
  iVar1._2_1_ = output[10];
  iVar1._3_1_ = output[0xb];
  return iVar1;
}

Assistant:

static int cmac_test_wth_cipher( int verbose,
                                 const char* testname,
                                 const unsigned char* key,
                                 int keybits,
                                 const unsigned char* messages,
                                 const unsigned int message_lengths[4],
                                 const unsigned char* expected_result,
                                 mbedtls_cipher_type_t cipher_type,
                                 int block_size,
                                 int num_tests )
{
    const mbedtls_cipher_info_t *cipher_info;
    int i, ret = 0;
    unsigned char output[MBEDTLS_CIPHER_BLKSIZE_MAX];

    cipher_info = mbedtls_cipher_info_from_type( cipher_type );
    if( cipher_info == NULL )
    {
        /* Failing at this point must be due to a build issue */
        ret = MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE;
        goto exit;
    }

    for( i = 0; i < num_tests; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  %s CMAC #%u: ", testname, i + 1 );

        if( ( ret = mbedtls_cipher_cmac( cipher_info, key, keybits, messages,
                                         message_lengths[i], output ) ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );
            goto exit;
        }

        if( ( ret = memcmp( output, &expected_result[i * block_size], block_size ) ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }
    ret = 0;

exit:
    return( ret );
}